

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoded_s2point_vector.cc
# Opt level: O1

void s2coding::EncodeS2PointVectorCompact(Span<const_Vector3<double>_> points,Encoder *encoder)

{
  Encoder *this;
  byte bVar1;
  VType VVar2;
  pointer puVar3;
  pointer puVar4;
  uint64 uVar5;
  uchar *puVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  size_t sVar10;
  uint uVar11;
  Encoder *in_RCX;
  bool *have_exceptions_00;
  ulong uVar12;
  s2coding *psVar13;
  int iVar14;
  unsigned_long_long value;
  s2coding *psVar15;
  s2coding *psVar16;
  long lVar17;
  s2coding *in_R8;
  int iVar18;
  ulong uVar19;
  Encoder *this_00;
  Span<const_Vector3<double>_> points_00;
  Span<const_unsigned_long_long> values_00;
  Span<const_Vector3<double>_> points_01;
  BlockCode BVar20;
  bool have_exceptions;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> exceptions;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> values;
  StringVectorEncoder blocks;
  int base_bits;
  vector<s2coding::CellPoint,_std::allocator<s2coding::CellPoint>_> cell_points;
  bool local_135;
  int local_134;
  S2LogMessage local_130;
  s2coding *local_120;
  Vector3<double> *local_118;
  iterator iStack_110;
  Vector3<double> *local_108;
  ulong local_f8;
  ulong local_f0;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> local_e8;
  uint64 local_d0;
  ulong local_c8;
  uint local_bc;
  s2coding *local_b8;
  Encoder *local_b0;
  long local_a8;
  s2coding *local_a0;
  long local_98;
  undefined8 local_90;
  StringVectorEncoder local_88;
  int local_4c;
  vector<s2coding::CellPoint,_std::allocator<s2coding::CellPoint>_> local_48;
  
  points_00.ptr_ = (pointer)points.len_;
  local_b8 = (s2coding *)points.ptr_;
  local_48.super__Vector_base<s2coding::CellPoint,_std::allocator<s2coding::CellPoint>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<s2coding::CellPoint,_std::allocator<s2coding::CellPoint>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<s2coding::CellPoint,_std::allocator<s2coding::CellPoint>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  points_00.len_ = (size_type)&local_48;
  iVar7 = ChooseBestLevel(local_b8,points_00,
                          (vector<s2coding::CellPoint,_std::allocator<s2coding::CellPoint>_> *)
                          in_RCX);
  if (iVar7 < 0) {
    points_01.len_ = (size_type)encoder;
    points_01.ptr_ = points_00.ptr_;
    EncodeS2PointVectorFast(local_b8,points_01,in_RCX);
LAB_0018d1c2:
    if (local_48.super__Vector_base<s2coding::CellPoint,_std::allocator<s2coding::CellPoint>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.
                      super__Vector_base<s2coding::CellPoint,_std::allocator<s2coding::CellPoint>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    return;
  }
  have_exceptions_00 = &local_135;
  local_b0 = encoder;
  ConvertCellsToValues(&local_e8,&local_48,iVar7,have_exceptions_00);
  local_90 = CONCAT71((int7)((ulong)have_exceptions_00 >> 8),local_135);
  local_bc = (uint)local_135;
  local_d0 = ChooseBase(&local_e8,iVar7,local_135,&local_4c);
  this_00 = local_b0;
  puVar4 = local_e8.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  puVar3 = local_e8.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  iVar18 = local_4c >> 3;
  Encoder::Ensure(local_b0,(long)(iVar18 + 2));
  lVar8 = (long)local_e8.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_e8.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3;
  uVar11 = (int)lVar8 - ((int)((ulong)((long)puVar4 - (long)puVar3) >> 3) - 1U & 0xfffffff0);
  if ((int)uVar11 < 0) {
    S2LogMessage::S2LogMessage
              ((S2LogMessage *)&local_88,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/encoded_s2point_vector.cc"
               ,0x1ae,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               local_88.offsets_.
               super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
               super__Vector_impl_data._M_finish,"Check failed: (last_block_count) >= (0) ",0x28);
  }
  else if ((uVar11 & 0x7fffffff) < 0x11) {
    if (iVar18 < 8) {
      if (iVar7 < 0x1f) {
        Encoder::put8(this_00,((char)lVar8 << 4 | (char)local_90 * '\b') - 0xf);
        Encoder::put8(this_00,(char)iVar7 * '\b' | (byte)iVar18);
        iVar14 = (iVar7 * 2 - local_4c) + 3;
        iVar7 = 0;
        if (0 < iVar14) {
          iVar7 = iVar14;
        }
        EncodeUintWithLength<unsigned_long_long>(local_d0 >> ((byte)iVar7 & 0x3f),iVar18,this_00);
        StringVectorEncoder::StringVectorEncoder(&local_88);
        local_118 = (Vector3<double> *)0x0;
        iStack_110._M_current = (Vector3<double> *)0x0;
        local_108 = (Vector3<double> *)0x0;
        if ((long)local_e8.
                  super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_e8.
                  super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                  _M_impl.super__Vector_impl_data._M_start != 0) {
          psVar15 = (s2coding *)
                    ((long)local_e8.
                           super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_e8.
                           super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3);
          this = &local_88.data_;
          psVar13 = (s2coding *)0x0;
          iVar7 = 0;
          do {
            uVar5 = local_d0;
            psVar16 = psVar15 + -(long)psVar13;
            if ((s2coding *)0xf < psVar16) {
              psVar16 = (s2coding *)0x10;
            }
            values_00.len_ = local_d0;
            values_00.ptr_ = (pointer)psVar16;
            local_120 = psVar13;
            local_a0 = psVar15;
            BVar20 = GetBlockCode((s2coding *)
                                  (local_e8.
                                   super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start + (long)psVar13),
                                  values_00,(ulong)local_bc,SUB81(in_R8,0));
            local_f0 = BVar20._0_8_;
            local_130._0_8_ = Encoder::length(this);
            if (local_88.offsets_.
                super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_88.offsets_.
                super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::
              _M_realloc_insert<unsigned_long_long>
                        (&local_88.offsets_,
                         (iterator)
                         local_88.offsets_.
                         super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                         ._M_impl.super__Vector_impl_data._M_finish,(unsigned_long_long *)&local_130
                        );
            }
            else {
              *local_88.offsets_.
               super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
               super__Vector_impl_data._M_finish = local_130._0_8_;
              local_88.offsets_.
              super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_88.offsets_.
                   super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
            uVar12 = local_f0;
            iVar18 = (int)local_f0 >> 2;
            local_f8 = CONCAT44(local_f8._4_4_,iVar18);
            Encoder::Ensure(this,((long)local_f0 >> 0x23) + (long)iVar18 * 8 + 1);
            uVar11 = (uint)BVar20.overlap_bits >> 2;
            iVar14 = (int)((long)uVar12 >> 0x23);
            iVar18 = iVar14 - uVar11;
            if (7 < iVar18) {
              S2LogMessage::S2LogMessage
                        (&local_130,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/encoded_s2point_vector.cc"
                         ,0x1cc,kFatal,(ostream *)&std::cerr);
              std::__ostream_insert<char,std::char_traits<char>>
                        (local_130.stream_,"Check failed: (offset_bytes - overlap_nibbles) <= (7) ",
                         0x36);
              goto LAB_0018d2cf;
            }
            if (0x10 < (int)local_f8) {
              S2LogMessage::S2LogMessage
                        (&local_130,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/encoded_s2point_vector.cc"
                         ,0x1ce,kFatal,(ostream *)&std::cerr);
              std::__ostream_insert<char,std::char_traits<char>>
                        (local_130.stream_,"Check failed: (delta_nibbles) <= (16) ",0x26);
              goto LAB_0018d2cf;
            }
            Encoder::put8(this,(byte)(uVar11 << 3) | (byte)iVar18 | (char)local_f8 * '\x10' - 0x10U)
            ;
            lVar8 = (long)iVar7;
            local_98 = lVar8 * 8;
            if (local_a0 == local_120) {
              local_134 = 0;
              uVar9 = 0xffffffffffffffff;
            }
            else {
              uVar12 = (long)local_a0 - lVar8;
              if (0xf < uVar12) {
                uVar12 = 0x10;
              }
              uVar9 = 0xffffffffffffffff;
              lVar17 = 0;
              local_134 = 0;
              do {
                if (local_e8.
                    super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                    _M_impl.super__Vector_impl_data._M_start[lVar8 + lVar17] == 0xffffffffffffffff)
                {
                  local_134 = local_134 + 1;
                }
                else {
                  if (local_e8.
                      super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                      _M_impl.super__Vector_impl_data._M_start[lVar8 + lVar17] < uVar5) {
                    S2LogMessage::S2LogMessage
                              (&local_130,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/encoded_s2point_vector.cc"
                               ,0x1d9,kFatal,(ostream *)&std::cerr);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (local_130.stream_,"Check failed: (values[i + j]) >= (base) ",0x28);
                    goto LAB_0018d2cf;
                  }
                  uVar19 = local_e8.
                           super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                           ._M_impl.super__Vector_impl_data._M_start[lVar8 + lVar17] - uVar5;
                  if (uVar19 < uVar9) {
                    uVar9 = uVar19;
                  }
                }
                lVar17 = lVar17 + 1;
              } while (uVar12 + (uVar12 == 0) != lVar17);
            }
            iVar7 = (int)local_f0 - BVar20.overlap_bits;
            uVar12 = ~(0xffffffffffffffffU >>
                      (-((char)local_f0 - (char)BVar20.overlap_bits) & 0x3fU));
            if (iVar7 == 0) {
              uVar12 = 0xffffffffffffffff;
            }
            uVar19 = 0;
            if (local_134 != (int)psVar16) {
              uVar19 = uVar9;
            }
            uVar19 = uVar19 & uVar12;
            if ((local_f0 >> 0x23 == 0) != (uVar19 == 0)) {
              S2LogMessage::S2LogMessage
                        (&local_130,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/encoded_s2point_vector.cc"
                         ,0x1e2,kFatal,(ostream *)&std::cerr);
              std::__ostream_insert<char,std::char_traits<char>>
                        (local_130.stream_,"Check failed: (offset == 0) == (offset_bytes == 0) ",
                         0x33);
              goto LAB_0018d2cf;
            }
            if (uVar19 != 0) {
              EncodeUintWithLength<unsigned_long_long>(uVar19 >> ((byte)iVar7 & 0x3f),iVar14,this);
            }
            if (iStack_110._M_current != local_118) {
              iStack_110._M_current = local_118;
            }
            in_R8 = local_120;
            local_c8 = uVar19;
            local_a8 = lVar8;
            if (local_a0 != local_120) {
              iVar7 = (int)local_f8 + 1;
              local_f8 = 0xffffffffffffffff >> (-(char)local_f0 & 0x3fU);
              local_c8 = uVar19 + local_d0;
              if ((int)local_f0 == 0) {
                local_f8 = 0;
              }
              uVar12 = (long)local_a0 - lVar8;
              if (0xf < uVar12) {
                uVar12 = 0x10;
              }
              uVar9 = 0;
              lVar17 = local_98;
              local_120 = local_b8 + lVar8 * 0x18;
              do {
                uVar19 = *(ulong *)((long)local_e8.
                                          super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                                          ._M_impl.super__Vector_impl_data._M_start +
                                   uVar9 * 8 + lVar17);
                if (uVar19 == 0xffffffffffffffff) {
                  value = ((long)iStack_110._M_current - (long)local_118 >> 3) * -0x5555555555555555
                  ;
                  if (iStack_110._M_current == local_108) {
                    std::vector<Vector3<double>,std::allocator<Vector3<double>>>::
                    _M_realloc_insert<Vector3<double>const&>
                              ((vector<Vector3<double>,std::allocator<Vector3<double>>> *)&local_118
                               ,iStack_110,(Vector3<double> *)local_120);
                  }
                  else {
                    (iStack_110._M_current)->c_[2] = *(VType *)(local_120 + 0x10);
                    VVar2 = *(VType *)(local_120 + 8);
                    (iStack_110._M_current)->c_[0] = *(VType *)local_120;
                    (iStack_110._M_current)->c_[1] = VVar2;
                    iStack_110._M_current = iStack_110._M_current + 1;
                  }
                }
                else {
                  if (uVar19 < local_c8) {
                    S2LogMessage::S2LogMessage
                              (&local_130,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/encoded_s2point_vector.cc"
                               ,0x1f0,kFatal,(ostream *)&std::cerr);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (local_130.stream_,"Check failed: (values[i + j]) >= (offset + base) "
                               ,0x31);
                    goto LAB_0018d2cf;
                  }
                  value = *(long *)((long)local_e8.
                                          super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                                          ._M_impl.super__Vector_impl_data._M_start +
                                   uVar9 * 8 + lVar17) - local_c8;
                  if ((char)local_90 != '\0') {
                    if (0xffffffffffffffef < value) {
                      S2LogMessage::S2LogMessage
                                (&local_130,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/encoded_s2point_vector.cc"
                                 ,499,kFatal,(ostream *)&std::cerr);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (local_130.stream_,"Check failed: (delta) <= (~0ULL - kBlockSize) ",
                                 0x2e);
                      goto LAB_0018d2cf;
                    }
                    value = value + 0x10;
                  }
                }
                puVar6 = local_88.data_.orig_;
                if (local_f8 < value) {
                  S2LogMessage::S2LogMessage
                            (&local_130,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/encoded_s2point_vector.cc"
                             ,0x1f7,kFatal,(ostream *)&std::cerr);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (local_130.stream_,
                             "Check failed: (delta) <= (BitMask(code.delta_bits)) ",0x34);
                  goto LAB_0018d2cf;
                }
                if ((uVar9 & 1) != 0 && (local_f0 & 4) != 0) {
                  sVar10 = Encoder::length(this);
                  bVar1 = puVar6[sVar10 - 1];
                  Encoder::RemoveLast(this,1);
                  value = value << 4 | (ulong)(bVar1 & 0xf);
                  lVar17 = local_98;
                }
                EncodeUintWithLength<unsigned_long_long>(value,iVar7 >> 1,this);
                uVar9 = uVar9 + 1;
                local_120 = local_120 + 0x18;
              } while (uVar12 + (uVar12 == 0) != uVar9);
            }
            this_00 = local_b0;
            if (0 < local_134) {
              sVar10 = (size_t)((int)iStack_110._M_current - (int)local_118);
              Encoder::Ensure(this,sVar10);
              memcpy(local_88.data_.buf_,local_118,sVar10);
              local_88.data_.buf_ = local_88.data_.buf_ + sVar10;
            }
            iVar7 = (int)local_a8 + 0x10;
            psVar13 = (s2coding *)(long)iVar7;
            psVar15 = (s2coding *)
                      ((long)local_e8.
                             super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_e8.
                             super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3);
          } while (psVar13 < psVar15);
        }
        StringVectorEncoder::Encode(&local_88,this_00);
        if (local_118 != (Vector3<double> *)0x0) {
          operator_delete(local_118);
        }
        Encoder::~Encoder(&local_88.data_);
        if (local_88.offsets_.
            super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_88.offsets_.
                          super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_e8.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_e8.
                          super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        goto LAB_0018d1c2;
      }
      S2LogMessage::S2LogMessage
                ((S2LogMessage *)&local_88,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/encoded_s2point_vector.cc"
                 ,0x1b1,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)
                 local_88.offsets_.
                 super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl
                 .super__Vector_impl_data._M_finish,"Check failed: (level) <= (30) ",0x1e);
    }
    else {
      S2LogMessage::S2LogMessage
                ((S2LogMessage *)&local_88,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/encoded_s2point_vector.cc"
                 ,0x1b0,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)
                 local_88.offsets_.
                 super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl
                 .super__Vector_impl_data._M_finish,"Check failed: (base_bytes) <= (7) ",0x22);
    }
  }
  else {
    S2LogMessage::S2LogMessage
              ((S2LogMessage *)&local_88,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/encoded_s2point_vector.cc"
               ,0x1af,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               local_88.offsets_.
               super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
               super__Vector_impl_data._M_finish,"Check failed: (last_block_count) <= (kBlockSize) "
               ,0x31);
  }
LAB_0018d2cf:
  abort();
}

Assistant:

void EncodeS2PointVectorCompact(Span<const S2Point> points, Encoder* encoder) {
  // OVERVIEW
  // --------
  //
  // We attempt to represent each S2Point as the center of an S2CellId.  All
  // S2CellIds must be at the same level.  Any points that cannot be encoded
  // exactly as S2CellId centers are stored as exceptions using 24 bytes each.
  // If there are so many exceptions that the CELL_IDS encoding does not save
  // significant space, we give up and use the uncompressed encoding.
  //
  // The first step is to choose the best S2CellId level.  This requires
  // converting each point to (face, si, ti) coordinates and checking whether
  // the point can be represented exactly as an S2CellId center at some level.
  // We then build a histogram of S2CellId levels (just like the similar code
  // in S2Polygon::Encode) and choose the best level (or give up, if there are
  // not enough S2CellId-encodable points).
  //
  // The simplest approach would then be to take all the S2CellIds and
  // right-shift them to remove all the constant bits at the chosen level.
  // This would give the best spatial locality and hence the smallest deltas.
  // However instead we give up some spatial locality and use the similar but
  // faster transformation described below.
  //
  // Each encodable point is first converted to the (sj, tj) representation
  // defined below:
  //
  //   sj = (((face & 3) << 30) | (si >> 1)) >> (30 - level);
  //   tj = (((face & 4) << 29) | ti) >> (31 - level);
  //
  // These two values encode the (face, si, ti) tuple using (2 * level + 3)
  // bits.  To see this, recall that "si" and "ti" are 31-bit values that all
  // share a common suffix consisting of a "1" bit followed by (30 - level)
  // "0" bits.  The code above right-shifts these values to remove the
  // constant bits and then prepends the bits for "face", yielding a total of
  // (level + 2) bits for "sj" and (level + 1) bits for "tj".
  //
  // We then combine (sj, tj) into one 64-bit value by interleaving bit pairs:
  //
  //   v = InterleaveBitPairs(sj, tj);
  //
  // (We could also interleave individual bits, but it is faster this way.)
  // The result is similar to right-shifting an S2CellId by (61 - 2 * level),
  // except that it is faster to decode and the spatial locality is not quite
  // as good.
  //
  // The 64-bit values are divided into blocks of size 8, and then each value is
  // encoded as the sum of a base value, a per-block offset, and a per-value
  // delta within that block:
  //
  //   v[i,j] = base + offset[i] + delta[i, j]
  //
  // where "i" represents a block and "j" represents an entry in that block.
  //
  // The deltas for each block are encoded using a fixed number of 4-bit nibbles
  // (1-16 nibbles per delta).  This allows any delta to be accessed in constant
  // time.
  //
  // The "offset" for each block is a 64-bit value encoded in 0-8 bytes.  The
  // offset is left-shifted such that it overlaps the deltas by a configurable
  // number of bits (either 0 or 4), called the "overlap".  The overlap and
  // offset length (0-8 bytes) are specified per block.  The reason for the
  // overlap is that it allows fewer delta bits to be used in some cases.  For
  // example if base == 0 and the range within a block is 0xf0 to 0x110, then
  // rather than using 12-bits deltas with an offset of 0, the overlap lets us
  // use 8-bits deltas with an offset of 0xf0 (saving 7 bytes per block).
  //
  // The global minimum value "base" is encoded using 0-7 bytes starting with
  // the most-significant non-zero bit possible for the chosen level.  For
  // example, if (level == 7) then the encoded values have at most 17 bits, so
  // if "base" is encoded in 1 byte then it is shifted to occupy bits 9-16.
  //
  // Example: at level == 15, there are at most 33 non-zero value bits.  The
  // following shows the bit positions covered by "base", "offset", and "delta"
  // assuming that "base" and "offset" are encoded in 2 bytes each, deltas are
  // encoded in 2 nibbles (1 byte) each, and "overlap" is 4 bits:
  //
  //   Base:             1111111100000000-----------------
  //   Offset:           -------------1111111100000000----
  //   Delta:            -------------------------00000000
  //   Overlap:                                   ^^^^
  //
  // The numbers (0 or 1) in this diagram denote the byte number of the encoded
  // value.  Notice that "base" is shifted so that it starts at the leftmost
  // possible bit, "delta" always starts at the rightmost possible bit (bit 0),
  // and "offset" is shifted so that it overlaps "delta" by the chosen "overlap"
  // (either 0 or 4 bits).  Also note that all of these values are summed, and
  // therefore each value can affect higher-order bits due to carries.
  //
  // NOTE(ericv): Encoding deltas in 4-bit rather than 8-bit length increments
  // reduces encoded sizes by about 7%.  Allowing a 4-bit overlap between the
  // offset and deltas reduces encoded sizes by about 1%.  Both optimizations
  // make the code more complex but don't affect running times significantly.
  //
  // ENCODING DETAILS
  // ----------------
  //
  // Now we can move on to the actual encodings.  First, there is a 2 byte
  // header encoded as follows:
  //
  //  Byte 0, bits 0-2: encoding_format (CELL_IDS)
  //  Byte 0, bit  3:   have_exceptions
  //  Byte 0, bits 4-7: (last_block_size - 1)
  //  Byte 1, bits 0-2: base_bytes
  //  Byte 1, bits 3-7: level (0-30)
  //
  // This is followed by an EncodedStringVector containing the encoded blocks.
  // Each block contains kBlockSize (8) values.  The total size of the
  // EncodeS2PointVector is not stored explicity, but instead is calculated as
  //
  //     num_values == kBlockSize * (num_blocks - 1) + last_block_size .
  //
  // (An empty vector has num_blocks == 0 and last_block_size == kBlockSize.)
  //
  // Each block starts with a 1 byte header containing the following:
  //
  //  Byte 0, bits 0-2: (offset_bytes - overlap_nibbles)
  //  Byte 0, bit  3:   overlap_nibbles
  //  Byte 0, bits 4-7: (delta_nibbles - 1)
  //
  // "overlap_nibbles" is either 0 or 1 (indicating an overlap of 0 or 4 bits),
  // while "offset_bytes" is in the range 0-8 (indicating the number of bytes
  // used to encode the offset for this block).  Note that some combinations
  // cannot be encoded: in particular, offset_bytes == 0 can only be encoded
  // with an overlap of 0 bits, and offset_bytes == 8 can only be encoded with
  // an overlap of 4 bits.  This allows us to encode offset lengths of 0-8
  // rather than just 0-7 without using an extra bit.  (Note that the
  // combinations that can't be encoded are not useful anyway.)
  //
  // The header is followed by "offset_bytes" bytes for the offset, and then
  // (4 * delta_nibbles) bytes for the deltas.
  //
  // If there are any points that could not be represented as S2CellIds, then
  // "have_exceptions" in the header is true.  In that case the delta values
  // within each block are encoded as (delta + 8), and values 0-7 are used to
  // represent exceptions.  If a block has exceptions, they are encoded
  // immediately following the array of deltas, and are referenced by encoding
  // the corresponding exception index (0-7) as the delta.
  //
  // TODO(ericv): A vector containing a single leaf cell is currently encoded as
  // 13 bytes (2 byte header, 7 byte base, 1 byte block count, 1 byte block
  // length, 1 byte block header, 1 byte delta).  However if this case occurs
  // often, a better solution would be implement a separate format that encodes
  // the leading k bytes of an S2CellId.  It would have a one-byte header
  // consisting of the encoding format (3 bits) and the number of bytes encoded
  // (3 bits), followed by the S2CellId bytes.  The extra 2 header bits could be
  // used to store single points using other encodings, e.g. E7.
  //
  // If we wind up using 8-value blocks, we could also use the extra bit in the
  // first byte of the header to indicate that there is only one value, and
  // then skip the 2nd byte of header and the EncodedStringVector.  But this
  // would be messy because it also requires special cases while decoding.
  // Essentially this would be a sub-format within the CELL_IDS format.

  // 1. Compute (level, face, si, ti) for each point, build a histogram of
  // levels, and determine the optimal level to use for encoding (if any).
  vector<CellPoint> cell_points;
  int level = ChooseBestLevel(points, &cell_points);
  if (level < 0) {
    return EncodeS2PointVectorFast(points, encoder);
  }

  // 2. Convert the points into encodable 64-bit values.  We don't use the
  // S2CellId itself because it requires a somewhat more complicated bit
  // interleaving operation.
  //
  // TODO(ericv): Benchmark using shifted S2CellIds instead.
  bool have_exceptions;
  vector<uint64> values = ConvertCellsToValues(cell_points, level,
                                               &have_exceptions);

  // 3. Choose the global encoding parameter "base" (consisting of the bit
  // prefix shared by all values to be encoded).
  int base_bits;
  uint64 base = ChooseBase(values, level, have_exceptions, &base_bits);

  // Now encode the output, starting with the 2-byte header (see above).
  int num_blocks = (values.size() + kBlockSize - 1) >> kBlockShift;
  int base_bytes = base_bits >> 3;
  encoder->Ensure(2 + base_bytes);
  int last_block_count = values.size() - kBlockSize * (num_blocks - 1);
  S2_DCHECK_GE(last_block_count, 0);
  S2_DCHECK_LE(last_block_count, kBlockSize);
  S2_DCHECK_LE(base_bytes, 7);
  S2_DCHECK_LE(level, 30);
  encoder->put8(EncodedS2PointVector::CELL_IDS |
                (have_exceptions << 3) |
                ((last_block_count - 1) << 4));
  encoder->put8(base_bytes | (level << 3));

  // Next we encode 0-7 bytes of "base".
  int base_shift = BaseShift(level, base_bits);
  EncodeUintWithLength(base >> base_shift, base_bytes, encoder);

  // Now we encode the contents of each block.
  StringVectorEncoder blocks;
  vector<S2Point> exceptions;
  uint64 offset_bytes_sum = 0;
  uint64 delta_nibbles_sum = 0;
  uint64 exceptions_sum = 0;
  for (int i = 0; i < values.size(); i += kBlockSize) {
    int block_size = min(kBlockSize, values.size() - i);
    BlockCode code = GetBlockCode(MakeSpan(&values[i], block_size),
                                  base, have_exceptions);

    // Encode the one-byte block header (see above).
    Encoder* block = blocks.AddViaEncoder();
    int offset_bytes = code.offset_bits >> 3;
    int delta_nibbles = code.delta_bits >> 2;
    int overlap_nibbles = code.overlap_bits >> 2;
    block->Ensure(1 + offset_bytes + (kBlockSize / 2) * delta_nibbles);
    S2_DCHECK_LE(offset_bytes - overlap_nibbles, 7);
    S2_DCHECK_LE(overlap_nibbles, 1);
    S2_DCHECK_LE(delta_nibbles, 16);
    block->put8((offset_bytes - overlap_nibbles) |
                (overlap_nibbles << 3) | (delta_nibbles - 1) << 4);

    // Determine the offset for this block, and whether there are exceptions.
    uint64 offset = ~0ULL;
    int num_exceptions = 0;
    for (int j = 0; j < block_size; ++j) {
      if (values[i + j] == kException) {
        num_exceptions += 1;
      } else {
        S2_DCHECK_GE(values[i + j], base);
        offset = min(offset, values[i + j] - base);
      }
    }
    if (num_exceptions == block_size) offset = 0;

    // Encode the offset.
    int offset_shift = code.delta_bits - code.overlap_bits;
    offset &= ~BitMask(offset_shift);
    S2_DCHECK_EQ(offset == 0, offset_bytes == 0);
    if (offset > 0) {
      EncodeUintWithLength(offset >> offset_shift, offset_bytes, block);
    }

    // Encode the deltas, and also gather any exceptions present.
    int delta_bytes = (delta_nibbles + 1) >> 1;
    exceptions.clear();
    for (int j = 0; j < block_size; ++j) {
      uint64 delta;
      if (values[i + j] == kException) {
        delta = exceptions.size();
        exceptions.push_back(points[i + j]);
      } else {
        S2_DCHECK_GE(values[i + j], offset + base);
        delta = values[i + j] - (offset + base);
        if (have_exceptions) {
          S2_DCHECK_LE(delta, ~0ULL - kBlockSize);
          delta += kBlockSize;
        }
      }
      S2_DCHECK_LE(delta, BitMask(code.delta_bits));
      if ((delta_nibbles & 1) && (j & 1)) {
        // Combine this delta with the high-order 4 bits of the previous delta.
        uint8 last_byte = *(block->base() + block->length() - 1);
        block->RemoveLast(1);
        delta = (delta << 4) | (last_byte & 0xf);
      }
      EncodeUintWithLength(delta, delta_bytes, block);
    }
    // Append any exceptions to the end of the block.
    if (num_exceptions > 0) {
      int exceptions_bytes = exceptions.size() * sizeof(S2Point);
      block->Ensure(exceptions_bytes);
      block->putn(exceptions.data(), exceptions_bytes);
    }
    offset_bytes_sum += offset_bytes;
    delta_nibbles_sum += delta_nibbles;
    exceptions_sum += num_exceptions;
  }
  blocks.Encode(encoder);
}